

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_util.cpp
# Opt level: O2

PeerManager * EnsurePeerman(NodeContext *node)

{
  PeerManager *pPVar1;
  UniValue *__return_storage_ptr__;
  long in_FS_OFFSET;
  allocator<char> local_41;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar1 = (node->peerman)._M_t.
           super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>._M_t.
           super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
           super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl;
  if (pPVar1 == (PeerManager *)0x0) {
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Error: Peer-to-peer functionality missing or disabled",&local_41
              );
    JSONRPCError(__return_storage_ptr__,-0x1f,&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pPVar1;
  }
  __stack_chk_fail();
}

Assistant:

PeerManager& EnsurePeerman(const NodeContext& node)
{
    if (!node.peerman) {
        throw JSONRPCError(RPC_CLIENT_P2P_DISABLED, "Error: Peer-to-peer functionality missing or disabled");
    }
    return *node.peerman;
}